

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_octahedron_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeOctahedronTransform::InitFromAttribute
          (AttributeOctahedronTransform *this,PointAttribute *attribute)

{
  AttributeTransformType AVar1;
  int iVar2;
  AttributeTransformData *this_00;
  long in_RDI;
  AttributeTransformData *transform_data;
  
  this_00 = PointAttribute::GetAttributeTransformData((PointAttribute *)0x20c371);
  if ((this_00 != (AttributeTransformData *)0x0) &&
     (AVar1 = AttributeTransformData::transform_type(this_00),
     AVar1 == ATTRIBUTE_OCTAHEDRON_TRANSFORM)) {
    iVar2 = AttributeTransformData::GetParameterValue<int>(this_00,(int)((ulong)in_RDI >> 0x20));
    *(int *)(in_RDI + 8) = iVar2;
    return true;
  }
  return false;
}

Assistant:

bool AttributeOctahedronTransform::InitFromAttribute(
    const PointAttribute &attribute) {
  const AttributeTransformData *const transform_data =
      attribute.GetAttributeTransformData();
  if (!transform_data ||
      transform_data->transform_type() != ATTRIBUTE_OCTAHEDRON_TRANSFORM) {
    return false;  // Wrong transform type.
  }
  quantization_bits_ = transform_data->GetParameterValue<int32_t>(0);
  return true;
}